

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O3

uint32_t spvtools::opt::anon_unknown_0::GetElementType
                   (uint32_t type_id,iterator start,iterator end,DefUseManager *def_use_manager)

{
  spv_operand_type_t sVar1;
  Op OVar2;
  bool bVar3;
  Instruction *this;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> _Var4;
  size_t sVar5;
  uint uVar6;
  uint32_t index;
  undefined1 local_58 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_38;
  
  if (start._M_current != end._M_current) {
    do {
      sVar1 = (start._M_current)->type;
      local_58._0_8_ = &PTR__SmallVector_00b02ef8;
      local_58._8_8_ = 0;
      local_58._24_8_ = local_58 + 0x10;
      local_38._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)local_58,&(start._M_current)->words);
      this = analysis::DefUseManager::GetDef(def_use_manager,type_id);
      if (sVar1 != SPV_OPERAND_TYPE_LITERAL_INTEGER) {
LAB_0056edf2:
        __assert_fail("index.type == SPV_OPERAND_TYPE_LITERAL_INTEGER && index.words.size() == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                      ,0x6a8,
                      "uint32_t spvtools::opt::(anonymous namespace)::GetElementType(uint32_t, Instruction::iterator, Instruction::iterator, const analysis::DefUseManager *)"
                     );
      }
      sVar5 = local_58._8_8_;
      if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )local_38._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        sVar5 = (long)*(pointer *)((long)local_38._M_head_impl + 8) - *(long *)local_38._M_head_impl
                >> 2;
      }
      if (sVar5 != 1) goto LAB_0056edf2;
      OVar2 = this->opcode_;
      if (OVar2 == OpTypeMatrix) {
LAB_0056ed62:
        index = (this->has_result_id_ & 1) + 1;
        if (this->has_type_id_ == false) {
          index = (uint)this->has_result_id_;
        }
LAB_0056ed99:
        type_id = Instruction::GetSingleWordOperand(this,index);
        bVar3 = true;
      }
      else {
        if (OVar2 == OpTypeStruct) {
          _Var4._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38;
          if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )local_38._M_head_impl == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0)
          {
            _Var4._M_head_impl =
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)local_58 + 0x18);
          }
          uVar6 = (this->has_result_id_ & 1) + 1;
          if (this->has_type_id_ == false) {
            uVar6 = (uint)this->has_result_id_;
          }
          index = uVar6 + *((_Var4._M_head_impl)->
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                           super__Vector_impl_data._M_start;
          goto LAB_0056ed99;
        }
        if (OVar2 == OpTypeArray) goto LAB_0056ed62;
        bVar3 = false;
      }
      local_58._0_8_ = &PTR__SmallVector_00b02ef8;
      if (local_38._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_38,local_38._M_head_impl);
      }
      if (!bVar3) {
        return 0;
      }
      start._M_current = start._M_current + 1;
    } while (start._M_current != end._M_current);
  }
  return type_id;
}

Assistant:

uint32_t GetElementType(uint32_t type_id, Instruction::iterator start,
                        Instruction::iterator end,
                        const analysis::DefUseManager* def_use_manager) {
  for (auto index : make_range(std::move(start), std::move(end))) {
    const Instruction* type_inst = def_use_manager->GetDef(type_id);
    assert(index.type == SPV_OPERAND_TYPE_LITERAL_INTEGER &&
           index.words.size() == 1);
    if (type_inst->opcode() == spv::Op::OpTypeArray) {
      type_id = type_inst->GetSingleWordInOperand(0);
    } else if (type_inst->opcode() == spv::Op::OpTypeMatrix) {
      type_id = type_inst->GetSingleWordInOperand(0);
    } else if (type_inst->opcode() == spv::Op::OpTypeStruct) {
      type_id = type_inst->GetSingleWordInOperand(index.words[0]);
    } else {
      return 0;
    }
  }
  return type_id;
}